

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectGenericLoopSelSwitch<duckdb::interval_t,duckdb::interval_t,duckdb::GreaterThan,false>
                (interval_t *ldata,interval_t *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  unsigned_long *puVar5;
  ulong uVar6;
  idx_t iVar7;
  SelectionVector *pSVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  idx_t iVar17;
  idx_t iVar18;
  idx_t local_78;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      if (count == 0) {
        lVar13 = 0;
      }
      else {
        psVar1 = result_sel->sel_vector;
        psVar2 = lsel->sel_vector;
        psVar3 = rsel->sel_vector;
        puVar4 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        puVar5 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        lVar13 = 0;
        uVar9 = 0;
        do {
          uVar6 = uVar9;
          if (psVar1 != (sel_t *)0x0) {
            uVar6 = (ulong)psVar1[uVar9];
          }
          uVar11 = uVar9;
          if (psVar2 != (sel_t *)0x0) {
            uVar11 = (ulong)psVar2[uVar9];
          }
          uVar10 = uVar9;
          if (psVar3 != (sel_t *)0x0) {
            uVar10 = (ulong)psVar3[uVar9];
          }
          if (((puVar4 == (unsigned_long *)0x0) ||
              ((puVar4[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0)) &&
             ((puVar5 == (unsigned_long *)0x0 || ((puVar5[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0)
              ))) {
            lVar12 = (long)ldata[uVar11].days + ldata[uVar11].micros / 86400000000;
            lVar16 = lVar12 % 0x1e;
            lVar15 = (long)ldata[uVar11].months + lVar12 / 0x1e;
            lVar14 = (long)rdata[uVar10].days + rdata[uVar10].micros / 86400000000;
            lVar12 = lVar14 % 0x1e;
            lVar14 = (long)rdata[uVar10].months + lVar14 / 0x1e;
            if ((lVar15 <= lVar14) &&
               ((lVar15 < lVar14 ||
                ((lVar16 <= lVar12 &&
                 ((lVar16 < lVar12 ||
                  (ldata[uVar11].micros % 86400000000 <= rdata[uVar10].micros % 86400000000))))))))
            goto LAB_0043530d;
          }
          else {
LAB_0043530d:
            false_sel->sel_vector[lVar13] = (sel_t)uVar6;
            lVar13 = lVar13 + 1;
          }
          uVar9 = uVar9 + 1;
        } while (count != uVar9);
      }
      return count - lVar13;
    }
    if (count != 0) {
      psVar1 = result_sel->sel_vector;
      psVar2 = lsel->sel_vector;
      psVar3 = rsel->sel_vector;
      puVar4 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      puVar5 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      local_78 = 0;
      uVar9 = 0;
      do {
        uVar6 = uVar9;
        if (psVar1 != (sel_t *)0x0) {
          uVar6 = (ulong)psVar1[uVar9];
        }
        uVar11 = uVar9;
        if (psVar2 != (sel_t *)0x0) {
          uVar11 = (ulong)psVar2[uVar9];
        }
        uVar10 = uVar9;
        if (psVar3 != (sel_t *)0x0) {
          uVar10 = (ulong)psVar3[uVar9];
        }
        if (((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0)
            ) && ((puVar5 == (unsigned_long *)0x0 ||
                  ((puVar5[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0)))) {
          lVar13 = (long)ldata[uVar11].days + ldata[uVar11].micros / 86400000000;
          lVar15 = lVar13 % 0x1e;
          lVar12 = (long)ldata[uVar11].months + lVar13 / 0x1e;
          lVar14 = (long)rdata[uVar10].days + rdata[uVar10].micros / 86400000000;
          lVar13 = lVar14 % 0x1e;
          lVar14 = (long)rdata[uVar10].months + lVar14 / 0x1e;
          if ((lVar14 < lVar12) ||
             ((lVar14 <= lVar12 &&
              ((lVar13 < lVar15 ||
               ((lVar13 <= lVar15 &&
                (rdata[uVar10].micros % 86400000000 < ldata[uVar11].micros % 86400000000)))))))) {
            true_sel->sel_vector[local_78] = (sel_t)uVar6;
            local_78 = local_78 + 1;
          }
        }
        uVar9 = uVar9 + 1;
      } while (count != uVar9);
      return local_78;
    }
  }
  else if (count != 0) {
    psVar1 = result_sel->sel_vector;
    psVar2 = lsel->sel_vector;
    psVar3 = rsel->sel_vector;
    puVar4 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    puVar5 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    local_78 = 0;
    uVar9 = 0;
    iVar17 = 0;
    do {
      uVar6 = uVar9;
      if (psVar1 != (sel_t *)0x0) {
        uVar6 = (ulong)psVar1[uVar9];
      }
      uVar11 = uVar9;
      if (psVar2 != (sel_t *)0x0) {
        uVar11 = (ulong)psVar2[uVar9];
      }
      uVar10 = uVar9;
      if (psVar3 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar3[uVar9];
      }
      if (((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0))
         && ((puVar5 == (unsigned_long *)0x0 || ((puVar5[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0))
            )) {
        lVar13 = (long)ldata[uVar11].days + ldata[uVar11].micros / 86400000000;
        lVar12 = lVar13 % 0x1e;
        lVar15 = (long)ldata[uVar11].months + lVar13 / 0x1e;
        lVar14 = (long)rdata[uVar10].days + rdata[uVar10].micros / 86400000000;
        lVar13 = lVar14 % 0x1e;
        lVar14 = (long)rdata[uVar10].months + lVar14 / 0x1e;
        if ((lVar15 <= lVar14) &&
           ((lVar15 < lVar14 ||
            ((lVar12 <= lVar13 &&
             ((lVar12 < lVar13 ||
              (ldata[uVar11].micros % 86400000000 <= rdata[uVar10].micros % 86400000000))))))))
        goto LAB_00434f62;
        iVar7 = local_78;
        pSVar8 = true_sel;
        iVar18 = iVar17;
        local_78 = local_78 + 1;
      }
      else {
LAB_00434f62:
        iVar18 = iVar17 + 1;
        iVar7 = iVar17;
        pSVar8 = false_sel;
      }
      pSVar8->sel_vector[iVar7] = (sel_t)uVar6;
      uVar9 = uVar9 + 1;
      iVar17 = iVar18;
      if (count == uVar9) {
        return local_78;
      }
    } while( true );
  }
  return 0;
}

Assistant:

static inline idx_t
	SelectGenericLoopSelSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                           const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                           const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                           ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, false>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, false, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		}
	}